

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O2

int CVmRun::set_index(vm_val_t *container_val,vm_val_t *index_val,vm_val_t *new_val)

{
  vm_datatype_t vVar1;
  uint uVar2;
  int iVar3;
  char *lst;
  
  vVar1 = container_val->typ;
  if (vVar1 != VM_OBJ) {
    if (vVar1 == VM_LIST) {
      lst = get_const_ptr((container_val->val).ofs);
      CVmObjList::set_index_list(container_val,lst,index_val,new_val);
    }
    return (uint)(vVar1 == VM_LIST);
  }
  uVar2 = (container_val->val).obj;
  iVar3 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar2 >> 0xc][uVar2 & 0xfff].ptr_ + 0x140))
                    (G_obj_table_X.pages_[uVar2 >> 0xc] + (uVar2 & 0xfff),container_val,uVar2,
                     index_val,new_val);
  return iVar3;
}

Assistant:

int CVmRun::set_index(VMG_ vm_val_t *container_val,
                      const vm_val_t *index_val,
                      const vm_val_t *new_val)
{
    switch(container_val->typ)
    {
    case VM_LIST:
        /* list constant - use the static list set-index method */
        CVmObjList::set_index_list(vmg_ container_val,
                                   get_const_ptr(vmg_ container_val->val.ofs),
                                   index_val, new_val);
        return TRUE;

    case VM_OBJ:
        /* object - use the object's virtual set-index method */
        return vm_objp(vmg_ container_val->val.obj)
            ->set_index_val_q(vmg_ container_val,
                              container_val->val.obj, index_val, new_val);
        
    default:
        /* other values cannot be indexed */
        return FALSE;
    }
}